

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>::
find<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_const,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
           *this,ArrayPtr<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
                 table,StringPtr *params)

{
  long lVar1;
  ulong uVar2;
  void *__s2;
  size_t __n;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  long lVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  Entry *pEVar8;
  undefined8 *in_R8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  Maybe<unsigned_long> MVar12;
  Maybe<unsigned_long> MVar13;
  ArrayPtr<const_unsigned_char> s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  
  MVar12.ptr.field_1.value = table.size_;
  pEVar8 = table.ptr;
  if (*(long *)&(pEVar8->value).prefixLength == 0) {
    *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
             )0x0;
    MVar12.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar12.ptr;
  }
  s.size_ = in_R8[1] - 1;
  s.ptr = (uchar *)*in_R8;
  uVar3 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
  lVar1 = *(long *)&pEVar8->value;
  uVar2 = *(ulong *)&(pEVar8->value).prefixLength;
  uVar11 = (ulong)((int)uVar2 - 1U & uVar3);
  uVar9 = *(uint *)(lVar1 + 4 + uVar11 * 8);
  aVar7 = extraout_RDX;
  if (uVar9 != 0) {
    puVar5 = (uint *)(uVar11 * 8 + lVar1);
    __s2 = (void *)*in_R8;
    __n = in_R8[1];
    do {
      if ((uVar9 != 1) && (*puVar5 == uVar3)) {
        lVar6 = (ulong)(uVar9 - 2) * 0x38;
        if (*(size_t *)(MVar12.ptr.field_1.value + 8 + lVar6) == __n) {
          if (__n != 0) {
            iVar4 = bcmp(*(void **)(lVar6 + MVar12.ptr.field_1.value),__s2,__n);
            if (iVar4 != 0) goto LAB_001825da;
          }
          aVar7.value = 0;
          *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(uVar9 - 2);
          goto LAB_00182613;
        }
      }
LAB_001825da:
      aVar7.value = 0;
      uVar10 = uVar11 + 1;
      uVar11 = uVar10 & 0xffffffff;
      if (uVar10 == uVar2) {
        uVar11 = 0;
      }
      puVar5 = (uint *)(uVar11 * 8 + lVar1);
      uVar9 = puVar5[1];
    } while (uVar9 != 0);
  }
  *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
           )0x0;
LAB_00182613:
  MVar13.ptr.field_1.value = aVar7.value;
  MVar13.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar13.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }